

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_timings.c
# Opt level: O3

int deep_dump(nvamemtiming_conf *conf)

{
  FILE *pFVar1;
  char filename [21];
  char local_28 [32];
  
  builtin_strncpy(local_28,"regs_timing_deep",0x11);
  pFVar1 = fopen(local_28,"wb");
  if (pFVar1 != (FILE *)0x0) {
    deep_dump_cold_1();
  }
  else {
    perror("Open regs_timing_deep");
  }
  return (uint)(pFVar1 == (FILE *)0x0);
}

Assistant:

int
deep_dump(struct nvamemtiming_conf *conf)
{
	char filename[21];
	int i;

	if (conf->range.start == -1 ||  conf->range.end == -1)
		sprintf(filename, "regs_timing_deep_%i_%i", conf->range.start, conf->range.end);
	else
		sprintf(filename, "regs_timing_deep");

	/* TODO: get this filename from the command line */
	FILE *outf = fopen(filename, "wb");
	if (!outf) {
		perror("Open regs_timing_deep");
		return 1;
	}

	if (nva_cards[conf->cnum].card_type >= 0xc0)
		timing_value_types = nvc0_timing_value_types;
	else
		timing_value_types = nv40_timing_value_types;

	if (conf->range.start == (unsigned char) -1)
		conf->range.start = 0;
	if (conf->range.end == (unsigned char) -1)
		conf->range.end = conf->vbios.timing_entry_length;

	fprintf(stderr, "Deep mode: Will iterate between %i and %i\n", conf->range.start, conf->range.end);

	launch(conf, outf, 0, NO_COLOR);

	/* iterate through the vbios timing values */
	for (i = 0; i < conf->vbios.timing_entry_length; i++) {
		uint8_t orig = conf->vbios.data[conf->vbios.timing_entry_offset + i];

		if (timing_value_types[i] == VALUE ||
			(timing_value_types[i] == EMPTY && orig > 0))
		{
			if (timing_value_types[i] == EMPTY && orig > 0)
				fprintf(outf, "WARNING: The following entry was supposed to be unused!\n");

			iterate_values(conf, outf, i, COLOR);
		} else if (timing_value_types[i] == BITFIELD) {
			iterate_bitfield(conf, outf, i, COLOR);
		} else if (timing_value_types[i] == EMPTY) {
			fprintf(outf, "timing entry [%u/%u] is supposed empty\n\n",
				i + 1, conf->vbios.timing_entry_length);
		}

		conf->vbios.data[conf->vbios.timing_entry_offset + i] = orig;
	}

	fclose(outf);

	return 0;
}